

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCommandLine.cpp
# Opt level: O2

void __thiscall tcu::DebugOutStreambuf::~DebugOutStreambuf(DebugOutStreambuf *this)

{
  long lVar1;
  
  *(undefined ***)this = &PTR__DebugOutStreambuf_00a326c0;
  lVar1 = std::ostream::tellp();
  if (lVar1 != 0) {
    flushLine(this);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&this->m_curLine);
  std::streambuf::~streambuf(this);
  return;
}

Assistant:

DebugOutStreambuf::~DebugOutStreambuf (void)
{
	if (m_curLine.tellp() != std::streampos(0))
		flushLine();
}